

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

int lua_checkstack(lua_State *L,int size)

{
  int iVar1;
  int iVar2;
  MSize need;
  
  iVar2 = 0;
  if ((size < 0x1f41) && ((long)size + ((long)L->top - (long)L->base >> 3) < 0x1f41)) {
    iVar2 = 1;
    if ((0 < size) &&
       (iVar1 = (int)((L->maxstack).ptr64 - (long)L->top >> 3), need = size - iVar1,
       need != 0 && iVar1 <= size)) {
      iVar1 = lj_state_cpgrowstack(L,need);
      if (iVar1 != 0) {
        L->top = L->top + -1;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

LUA_API int lua_checkstack(lua_State *L, int size)
{
  if (size > LUAI_MAXCSTACK || (L->top - L->base + size) > LUAI_MAXCSTACK) {
    return 0;  /* Stack overflow. */
  } else if (size > 0) {
    int avail = (int)(mref(L->maxstack, TValue) - L->top);
    if (size > avail &&
	lj_state_cpgrowstack(L, (MSize)(size - avail)) != LUA_OK) {
      L->top--;
      return 0;  /* Out of memory. */
    }
  }
  return 1;
}